

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadPackedPrimitiveNoInline<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (CodedInputStream *input,RepeatedField<int> *values)

{
  uint8 uVar1;
  uint8 *puVar2;
  bool bVar3;
  Limit limit;
  int iVar4;
  uint32 uVar5;
  uint32 length;
  uint32 temp;
  uint32 local_30;
  uint32 local_2c;
  
  puVar2 = input->buffer_;
  if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
    input->buffer_ = puVar2 + 1;
    local_30 = (int)(char)uVar1;
  }
  else {
    bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_30);
    if (!bVar3) {
      return false;
    }
  }
  limit = io::CodedInputStream::PushLimit(input,local_30);
  iVar4 = io::CodedInputStream::BytesUntilLimit(input);
  if (0 < iVar4) {
    do {
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (uVar1 = *puVar2, -1 < (char)uVar1)) {
        input->buffer_ = puVar2 + 1;
        uVar5 = (int)(char)uVar1;
      }
      else {
        bVar3 = io::CodedInputStream::ReadVarint32Fallback(input,&local_2c);
        uVar5 = local_2c;
        if (!bVar3) {
          return false;
        }
      }
      iVar4 = values->current_size_;
      if (iVar4 == values->total_size_) {
        RepeatedField<int>::Reserve(values,iVar4 + 1);
        iVar4 = values->current_size_;
      }
      values->current_size_ = iVar4 + 1;
      values->elements_[iVar4] = uVar5;
      iVar4 = io::CodedInputStream::BytesUntilLimit(input);
    } while (0 < iVar4);
  }
  io::CodedInputStream::PopLimit(input,limit);
  return true;
}

Assistant:

bool WireFormatLite::ReadPackedPrimitiveNoInline(io::CodedInputStream* input,
                                                 RepeatedField<CType>* values) {
  return ReadPackedPrimitive<CType, DeclaredType>(input, values);
}